

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metrics.c
# Opt level: O0

unsigned_long total_jiffies_func(void)

{
  uint uVar1;
  double dVar2;
  int num_cpustates;
  sensor_slurp proc_stat;
  unsigned_long sirq_jiffies;
  unsigned_long irq_jiffies;
  unsigned_long wio_jiffies;
  unsigned_long idle_jiffies;
  unsigned_long system_jiffies;
  unsigned_long nice_jiffies;
  unsigned_long user_jiffies;
  char *p;
  char *in_stack_ffffffffffffdf90;
  char **__endptr;
  undefined1 local_2050 [8208];
  ulong local_40;
  ulong local_38;
  ulong local_30;
  ulong local_28;
  ulong local_20;
  ulong local_18;
  char *local_10;
  unsigned_long local_8;
  
  memcpy(local_2050,&PTR_anon_var_dwarf_2a827_0017eab8,0x2008);
  local_10 = update_file((sensor_slurp *)0x14f86c);
  local_10 = skip_token(in_stack_ffffffffffffdf90);
  local_10 = skip_whitespace((char *)0x14f896);
  dVar2 = strtod(local_10,&local_10);
  local_18 = (long)dVar2 & 0xffffffff;
  local_10 = skip_whitespace((char *)0x14f8d4);
  dVar2 = strtod(local_10,&local_10);
  local_20 = (long)dVar2 & 0xffffffff;
  local_10 = skip_whitespace((char *)0x14f90a);
  dVar2 = strtod(local_10,&local_10);
  local_28 = (long)dVar2 & 0xffffffff;
  local_10 = skip_whitespace((char *)0x14f940);
  dVar2 = strtod(local_10,&local_10);
  local_30 = (long)dVar2 & 0xffffffff;
  uVar1 = num_cpustates_func();
  if (uVar1 == 4) {
    local_8 = local_18 + local_20 + local_28 + local_30;
  }
  else {
    local_10 = skip_whitespace((char *)0x14f9b3);
    __endptr = &local_10;
    dVar2 = strtod(local_10,__endptr);
    local_38 = (long)dVar2 & 0xffffffff;
    local_10 = skip_whitespace((char *)0x14f9f1);
    dVar2 = strtod(local_10,__endptr);
    local_40 = (long)dVar2 & 0xffffffff;
    local_10 = skip_whitespace((char *)0x14fa27);
    dVar2 = strtod(local_10,__endptr);
    local_8 = local_18 + local_20 + local_28 + local_30 + local_38 + local_40 +
              ((long)dVar2 & 0xffffffffU);
  }
  return local_8;
}

Assistant:

unsigned long total_jiffies_func ( void ) {

   char *p;
   unsigned long user_jiffies, nice_jiffies, system_jiffies, idle_jiffies,
                 wio_jiffies, irq_jiffies, sirq_jiffies;
	
   sensor_slurp proc_stat = { "/proc/stat" };
   p = update_file(&proc_stat);
   p = skip_token(p);
   p = skip_whitespace(p);
   user_jiffies = (unsigned int)strtod( p, &p );
   p = skip_whitespace(p);
   nice_jiffies = (unsigned int)strtod( p, &p ); 
   p = skip_whitespace(p);
   system_jiffies = (unsigned int)strtod( p , &p ); 
   p = skip_whitespace(p);
   idle_jiffies = (unsigned int)strtod( p , &p );

   int num_cpustates = num_cpustates_func();
   if(num_cpustates == 4) /*NUM_CPUSTATES_24X*/
       return user_jiffies + nice_jiffies + system_jiffies + idle_jiffies;

   p = skip_whitespace(p);
   wio_jiffies = (unsigned int)strtod( p , &p );
   p = skip_whitespace(p);
   irq_jiffies = (unsigned int)strtod( p , &p );
   p = skip_whitespace(p);
   sirq_jiffies = (unsigned int)strtod( p , &p );
  
   return user_jiffies + nice_jiffies + system_jiffies + idle_jiffies +
          wio_jiffies + irq_jiffies + sirq_jiffies; 
}